

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

void Abc_SuppGenSelectVar(Vec_Wrd_t *p,int nBits,int iVar)

{
  word *pwVar1;
  word *pLimit;
  word *pEntry;
  int iVar_local;
  int nBits_local;
  Vec_Wrd_t *p_local;
  
  pLimit = Vec_WrdArray(p);
  pwVar1 = Vec_WrdLimit(p);
  for (; pLimit < pwVar1; pLimit = pLimit + 1) {
    if ((*pLimit >> ((byte)iVar & 0x3f) & 1) != 0) {
      *pLimit = 1L << ((byte)nBits & 0x3f) ^ *pLimit;
    }
  }
  return;
}

Assistant:

void Abc_SuppGenSelectVar( Vec_Wrd_t * p, int nBits, int iVar )
{
    word * pEntry = Vec_WrdArray(p);
    word * pLimit = Vec_WrdLimit(p);
    for ( ; pEntry < pLimit; pEntry++ )
        if ( (*pEntry >> iVar) & 1 )
            *pEntry ^= (((word)1) << nBits);
}